

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_socket.cpp
# Opt level: O2

ssize_t __thiscall sockpp::stream_socket::write(stream_socket *this,int __fd,void *__buf,size_t __n)

{
  socket *this_00;
  long ret;
  undefined4 in_register_00000034;
  
  this_00 = (socket *)
            writev(*(int *)(CONCAT44(in_register_00000034,__fd) + 8),*__buf,
                   (int)((ulong)(*(long *)((long)__buf + 8) - (long)*__buf) >> 4));
  socket::check_res<long,unsigned_long>((result<unsigned_long> *)this,this_00,ret);
  return (ssize_t)this;
}

Assistant:

result<size_t> stream_socket::write(const std::vector<iovec>& ranges) {
#if !defined(_WIN32)
    return check_res<ssize_t, size_t>(::writev(handle(), ranges.data(), int(ranges.size())));
#else
    std::vector<WSABUF> bufs;
    for (const auto& iovec : ranges) {
        bufs.push_back({static_cast<ULONG>(iovec.iov_len), static_cast<CHAR*>(iovec.iov_base)}
        );
    }

    DWORD nwritten = 0, nmsg = DWORD(bufs.size());

    if (::WSASend(handle(), bufs.data(), nmsg, &nwritten, 0, nullptr, nullptr) ==
        SOCKET_ERROR)
        return result<size_t>::from_last_error();
    return size_t(nwritten);
#endif
}